

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O1

void Saig_ManDemiterLabel_rec(Aig_Man_t *p,Aig_Obj_t *pObj,int Value)

{
  ulong uVar1;
  uint uVar2;
  Aig_Obj_t **ppAVar3;
  
  do {
    if (pObj->TravId == p->nTravIds) {
      return;
    }
    pObj->TravId = p->nTravIds;
    uVar1 = *(ulong *)&pObj->field_0x18;
    *(ulong *)&pObj->field_0x18 = (ulong)(Value != 0) * 0x10 + 0x10 | uVar1;
    uVar2 = (uint)uVar1;
    if ((uVar2 & 7) == 2) {
      if ((pObj->field_0).CioId < p->nTruePis) {
        return;
      }
      if ((pObj->field_0).CioId < p->nTruePis) goto LAB_0065b607;
      if ((pObj->field_0).CioId < p->nTruePis) {
        __assert_fail("Saig_ObjIsLo(p, pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saig.h"
                      ,0x56,"Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)");
      }
      uVar2 = ((pObj->field_0).CioId - p->nTruePis) + p->nTruePos;
      if (((int)uVar2 < 0) || (p->vCos->nSize <= (int)uVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      ppAVar3 = (Aig_Obj_t **)((long)p->vCos->pArray[uVar2] + 8);
    }
    else {
LAB_0065b607:
      if ((uVar2 & 7) - 7 < 0xfffffffe) {
        __assert_fail("Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigMiter.c"
                      ,0x357,"void Saig_ManDemiterLabel_rec(Aig_Man_t *, Aig_Obj_t *, int)");
      }
      Saig_ManDemiterLabel_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),Value);
      ppAVar3 = &pObj->pFanin1;
    }
    pObj = (Aig_Obj_t *)((ulong)*ppAVar3 & 0xfffffffffffffffe);
  } while( true );
}

Assistant:

void Saig_ManDemiterLabel_rec( Aig_Man_t * p, Aig_Obj_t * pObj, int Value )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Value ) 
        pObj->fMarkB = 1;
    else
        pObj->fMarkA = 1;
    if ( Saig_ObjIsPi(p, pObj) )
        return;
    if ( Saig_ObjIsLo(p, pObj) )
    {
        Saig_ManDemiterLabel_rec( p, Aig_ObjFanin0( Saig_ObjLoToLi(p, pObj) ), Value );
        return;
    }
    assert( Aig_ObjIsNode(pObj) );
    Saig_ManDemiterLabel_rec( p, Aig_ObjFanin0(pObj), Value );
    Saig_ManDemiterLabel_rec( p, Aig_ObjFanin1(pObj), Value );
}